

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_json_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_34;
  char *pcStack_30;
  int nByte;
  char *zJSON;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zJSON = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    pcStack_30 = jx9_value_to_string(*(jx9_value **)zJSON,&local_34);
    if (local_34 < 1) {
      jx9_result_null(pjStack_18);
      return 0;
    }
    jx9JsonDecode(pjStack_18,pcStack_30,local_34);
    return 0;
  }
  jx9_result_null(pjStack_18);
  return 0;
}

Assistant:

static int vm_builtin_json_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zJSON;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the JSON string */
	zJSON = jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Decode the raw JSON */
	jx9JsonDecode(pCtx,zJSON,nByte);
	return JX9_OK;
}